

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa.cpp
# Opt level: O3

void __thiscall mocker::SSADestruction::replacePhisWithParallelCopies(SSADestruction *this)

{
  FunctionModule *pFVar1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  list<mocker::SSADestruction::Copy,std::allocator<mocker::SSADestruction::Copy>> *this_01;
  _Node *p_Var5;
  iterator iVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  shared_ptr<mocker::ir::Reg> dest;
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  preds;
  shared_ptr<mocker::ir::Addr> local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  shared_ptr<mocker::ir::Reg> local_b0;
  shared_ptr<mocker::ir::Addr> local_a0;
  _List_node_base *local_90;
  _List_node_base *local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_80;
  _List_node_base *local_78;
  _List_node_base *local_70;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  buildBlockPredecessors
            ((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)&local_68,(this->super_FuncPass).func);
  pFVar1 = (this->super_FuncPass).func;
  p_Var7 = (pFVar1->bbs).
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  local_90 = (_List_node_base *)&pFVar1->bbs;
  if (p_Var7 != local_90) {
    local_80 = &(this->addresses)._M_h;
    do {
      local_78 = (_List_node_base *)&p_Var7[1]._M_prev;
      p_Var8 = p_Var7[1]._M_prev;
      local_88 = p_Var7;
      if (p_Var8 != local_78) {
        do {
          p_Var7 = p_Var8[1]._M_next;
          if (*(int *)&p_Var7->_M_prev != 0xf) break;
          local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[1]._M_prev;
          if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_b8->_M_use_count = local_b8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_b8->_M_use_count = local_b8->_M_use_count + 1;
            }
          }
          local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)((long)(p_Var7 + 1) + 8);
          local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7[2]._M_next;
          if (local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_M_use_count =
                   (local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_M_use_count =
                   (local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          ir::dycLocalReg((ir *)&local_b0,&local_c8);
          if (local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          p_Var2 = p_Var7[3]._M_next;
          for (p_Var7 = *(_List_node_base **)((long)(p_Var7 + 2) + 8); p_Var7 != p_Var2;
              p_Var7 = p_Var7 + 2) {
            local_70 = (p_Var7[1]._M_next)->_M_prev;
            this_01 = (list<mocker::SSADestruction::Copy,std::allocator<mocker::SSADestruction::Copy>>
                       *)std::__detail::
                         _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&this->parallelCopies,(key_type *)&local_70);
            local_a0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 &(local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_Addr;
            local_a0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
            if (local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            ir::dycLocalReg((ir *)&local_c8,&local_a0);
            p_Var5 = std::__cxx11::
                     list<mocker::SSADestruction::Copy,std::allocator<mocker::SSADestruction::Copy>>
                     ::
                     _M_create_node<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Addr>const&>
                               (this_01,(shared_ptr<mocker::ir::Reg> *)&local_c8,
                                (shared_ptr<mocker::ir::Addr> *)p_Var7);
            std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
            *(long *)(this_01 + 0x10) = *(long *)(this_01 + 0x10) + 1;
            if (local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_a0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_a0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          iVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(local_80,&(local_b0.
                                    super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->identifier);
          if (iVar6.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
          }
          local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::ir::Load,std::allocator<mocker::ir::Load>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                    (&local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Load **)&local_c8,(allocator<mocker::ir::Load> *)&local_a0,
                     &local_b0,
                     (shared_ptr<mocker::ir::Reg> *)
                     ((long)iVar6.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                            ._M_cur + 0x28));
          _Var4._M_pi = local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          peVar3 = local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[1]._M_prev;
          p_Var8[1]._M_next = (_List_node_base *)peVar3;
          p_Var8[1]._M_prev = (_List_node_base *)_Var4._M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            if (local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_c8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          if (local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b0.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
          }
          p_Var8 = p_Var8->_M_next;
        } while (p_Var8 != local_78);
      }
      p_Var7 = local_88->_M_next;
    } while (p_Var7 != local_90);
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void SSADestruction::replacePhisWithParallelCopies() {
  auto preds = buildBlockPredecessors(func);

  for (auto &bb : func.getMutableBBs()) {
    for (auto &inst : bb.getMutableInsts()) {
      auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        break;

      auto dest = ir::dycLocalReg(phi->getDest());
      for (auto &option : phi->getOptions())
        parallelCopies[option.second->getID()].emplace_back(
            ir::dycLocalReg(dest), option.first);
      inst =
          std::make_shared<ir::Load>(dest, addresses.at(dest->getIdentifier()));
    }
  }
}